

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureBase.hpp
# Opt level: O0

void __thiscall
Diligent::TextureBase<Diligent::EngineGLImplTraits>::CreateView
          (TextureBase<Diligent::EngineGLImplTraits> *this,TextureViewDesc *ViewDesc,
          ITextureView **ppView)

{
  BIND_FLAGS BVar1;
  Char *pCVar2;
  char (*in_R8) [56];
  undefined1 local_f0 [8];
  string msg_5;
  string msg_4;
  string msg_3;
  string msg_2;
  string msg_1;
  undefined1 local_40 [8];
  string msg;
  ITextureView **ppView_local;
  TextureViewDesc *ViewDesc_local;
  TextureBase<Diligent::EngineGLImplTraits> *this_local;
  
  msg.field_2._8_8_ = ppView;
  if (ViewDesc->ViewType == TEXTURE_VIEW_UNDEFINED) {
    FormatString<char[35]>((string *)local_40,(char (*) [35])"Texture view type is not specified");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"CreateView",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TextureBase.hpp"
               ,0x97);
    std::__cxx11::string::~string((string *)local_40);
  }
  if (ViewDesc->ViewType == TEXTURE_VIEW_SHADER_RESOURCE) {
    BVar1 = Diligent::operator&((this->
                                super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                                ).m_Desc.BindFlags,BIND_SHADER_RESOURCE);
    if (BVar1 == BIND_NONE) {
      FormatString<char[39],char_const*,char[55]>
                ((string *)((long)&msg_2.field_2 + 8),
                 (Diligent *)"Attempting to create SRV for texture \'",
                 (char (*) [39])
                 &(this->
                  super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                  ).m_Desc,(char **)"\' that was not created with BIND_SHADER_RESOURCE flag.",
                 (char (*) [55])in_R8);
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar2,"CreateView",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TextureBase.hpp"
                 ,0x99);
      std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
    }
  }
  else if (ViewDesc->ViewType == TEXTURE_VIEW_UNORDERED_ACCESS) {
    BVar1 = Diligent::operator&((this->
                                super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                                ).m_Desc.BindFlags,BIND_UNORDERED_ACCESS);
    if (BVar1 == BIND_NONE) {
      FormatString<char[39],char_const*,char[56]>
                ((string *)((long)&msg_3.field_2 + 8),
                 (Diligent *)"Attempting to create UAV for texture \'",
                 (char (*) [39])
                 &(this->
                  super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                  ).m_Desc,(char **)"\' that was not created with BIND_UNORDERED_ACCESS flag.",in_R8
                );
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar2,"CreateView",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TextureBase.hpp"
                 ,0x9b);
      std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
    }
  }
  else if (ViewDesc->ViewType == TEXTURE_VIEW_RENDER_TARGET) {
    BVar1 = Diligent::operator&((this->
                                super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                                ).m_Desc.BindFlags,BIND_RENDER_TARGET);
    if (BVar1 == BIND_NONE) {
      FormatString<char[39],char_const*,char[53]>
                ((string *)((long)&msg_4.field_2 + 8),
                 (Diligent *)"Attempting to create RTV for texture \'",
                 (char (*) [39])
                 &(this->
                  super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                  ).m_Desc,(char **)"\' that was not created with BIND_RENDER_TARGET flag.",
                 (char (*) [53])in_R8);
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar2,"CreateView",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TextureBase.hpp"
                 ,0x9d);
      std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
    }
  }
  else if ((ViewDesc->ViewType == TEXTURE_VIEW_DEPTH_STENCIL) ||
          (ViewDesc->ViewType == TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL)) {
    BVar1 = Diligent::operator&((this->
                                super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                                ).m_Desc.BindFlags,BIND_DEPTH_STENCIL);
    if (BVar1 == BIND_NONE) {
      FormatString<char[39],char_const*,char[53]>
                ((string *)((long)&msg_5.field_2 + 8),
                 (Diligent *)"Attempting to create DSV for texture \'",
                 (char (*) [39])
                 &(this->
                  super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                  ).m_Desc,(char **)"\' that was not created with BIND_DEPTH_STENCIL flag.",
                 (char (*) [53])in_R8);
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar2,"CreateView",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TextureBase.hpp"
                 ,0x9f);
      std::__cxx11::string::~string((string *)(msg_5.field_2._M_local_buf + 8));
    }
  }
  else {
    FormatString<char[30]>((string *)local_f0,(char (*) [30])"Unexpected texture view type.");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"CreateView",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TextureBase.hpp"
               ,0xa1);
    std::__cxx11::string::~string((string *)local_f0);
  }
  (**(code **)((long)(this->
                     super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                     ).super_ObjectBase<Diligent::ITextureGL>.
                     super_RefCountedObject<Diligent::ITextureGL>.super_ITextureGL.super_ITexture.
                     super_IDeviceObject.super_IObject + 0x90))(this,ViewDesc,msg.field_2._8_8_,0);
  return;
}

Assistant:

CreateView(const struct TextureViewDesc& ViewDesc, ITextureView** ppView) override
    {
        DEV_CHECK_ERR(ViewDesc.ViewType != TEXTURE_VIEW_UNDEFINED, "Texture view type is not specified");
        if (ViewDesc.ViewType == TEXTURE_VIEW_SHADER_RESOURCE)
            DEV_CHECK_ERR(this->m_Desc.BindFlags & BIND_SHADER_RESOURCE, "Attempting to create SRV for texture '", this->m_Desc.Name, "' that was not created with BIND_SHADER_RESOURCE flag.");
        else if (ViewDesc.ViewType == TEXTURE_VIEW_UNORDERED_ACCESS)
            DEV_CHECK_ERR(this->m_Desc.BindFlags & BIND_UNORDERED_ACCESS, "Attempting to create UAV for texture '", this->m_Desc.Name, "' that was not created with BIND_UNORDERED_ACCESS flag.");
        else if (ViewDesc.ViewType == TEXTURE_VIEW_RENDER_TARGET)
            DEV_CHECK_ERR(this->m_Desc.BindFlags & BIND_RENDER_TARGET, "Attempting to create RTV for texture '", this->m_Desc.Name, "' that was not created with BIND_RENDER_TARGET flag.");
        else if (ViewDesc.ViewType == TEXTURE_VIEW_DEPTH_STENCIL || ViewDesc.ViewType == TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL)
            DEV_CHECK_ERR(this->m_Desc.BindFlags & BIND_DEPTH_STENCIL, "Attempting to create DSV for texture '", this->m_Desc.Name, "' that was not created with BIND_DEPTH_STENCIL flag.");
        else
            UNEXPECTED("Unexpected texture view type.");

        CreateViewInternal(ViewDesc, ppView, false);
    }